

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_ast_t * mpc_ast_traverse_next(mpc_ast_trav_t **trav)

{
  int iVar1;
  mpc_ast_trav_order_t mVar2;
  mpc_ast_t *pmVar3;
  mpc_ast_trav_t *pmVar4;
  mpc_ast_t *pmVar5;
  long lVar6;
  mpc_ast_trav_t *pmVar7;
  
  pmVar7 = *trav;
  if (pmVar7 != (mpc_ast_trav_t *)0x0) {
    if (pmVar7->order == mpc_ast_trav_order_post) {
      pmVar3 = pmVar7->curr_node;
      *trav = pmVar7->parent;
      free(pmVar7);
      pmVar7 = *trav;
      if (pmVar7 == (mpc_ast_trav_t *)0x0) {
        return pmVar3;
      }
      lVar6 = (long)pmVar7->curr_child + 1;
      pmVar7->curr_child = (int)lVar6;
      pmVar5 = pmVar7->curr_node;
      if (pmVar5->children_num < 1 || pmVar5->children_num <= (int)lVar6) {
        return pmVar3;
      }
      mVar2 = pmVar7->order;
      do {
        pmVar4 = (mpc_ast_trav_t *)malloc(0x18);
        pmVar5 = pmVar5->children[lVar6];
        pmVar4->curr_node = pmVar5;
        pmVar4->parent = pmVar7;
        pmVar4->curr_child = 0;
        pmVar4->order = mVar2;
        *trav = pmVar4;
        lVar6 = 0;
        pmVar7 = pmVar4;
      } while (0 < pmVar5->children_num);
      return pmVar3;
    }
    if (pmVar7->order == mpc_ast_trav_order_pre) {
      pmVar3 = pmVar7->curr_node;
      do {
        iVar1 = pmVar7->curr_child;
        pmVar5 = pmVar7->curr_node;
        if (iVar1 < pmVar5->children_num) {
          pmVar4 = (mpc_ast_trav_t *)malloc(0x18);
          pmVar4->curr_node = pmVar5->children[iVar1];
          pmVar4->parent = pmVar7;
          pmVar4->curr_child = 0;
          pmVar4->order = pmVar7->order;
          pmVar7->curr_child = iVar1 + 1;
          *trav = pmVar4;
          return pmVar3;
        }
        *trav = pmVar7->parent;
        free(pmVar7);
        pmVar7 = *trav;
      } while (pmVar7 != (mpc_ast_trav_t *)0x0);
      return pmVar3;
    }
  }
  return (mpc_ast_t *)0x0;
}

Assistant:

mpc_ast_t *mpc_ast_traverse_next(mpc_ast_trav_t **trav) {
  mpc_ast_trav_t *n_trav, *to_free;
  mpc_ast_t *ret = NULL;
  int cchild;

  /* The end of traversal was reached */
  if(*trav == NULL) return NULL;

  switch((*trav)->order) {
    case mpc_ast_trav_order_pre:
      ret = (*trav)->curr_node;

      /* If there aren't any more children, go up */
      while(*trav != NULL &&
        (*trav)->curr_child >= (*trav)->curr_node->children_num)
      {
        to_free = *trav;
        *trav = (*trav)->parent;
        free(to_free);
      }

      /* If trav is NULL, the end was reached */
      if(*trav == NULL) {
        break;
      }

      /* Go to next child */
      n_trav = malloc(sizeof(mpc_ast_trav_t));

      cchild = (*trav)->curr_child;
      n_trav->curr_node = (*trav)->curr_node->children[cchild];
      n_trav->parent = *trav;
      n_trav->curr_child = 0;
      n_trav->order = (*trav)->order;

      (*trav)->curr_child++;
      *trav = n_trav;

      break;

    case mpc_ast_trav_order_post:
      ret = (*trav)->curr_node;

      /* Move up tree to the parent If the parent doesn't have any more nodes,
       * then this is the current node. If it does, move down to its left most
       * child. Also, free the previous traversal node */
      to_free = *trav;
      *trav = (*trav)->parent;
      free(to_free);

      if(*trav == NULL)
        break;

      /* Next child */
      (*trav)->curr_child++;

      /* If there aren't any more children, this is the next node */
      if((*trav)->curr_child >= (*trav)->curr_node->children_num) {
        break;
      }

      /* If there are still more children, find the leftmost child from this
       * node */
      while((*trav)->curr_node->children_num > 0) {
        n_trav = malloc(sizeof(mpc_ast_trav_t));

        cchild = (*trav)->curr_child;
        n_trav->curr_node = (*trav)->curr_node->children[cchild];
        n_trav->parent = *trav;
        n_trav->curr_child = 0;
        n_trav->order = (*trav)->order;

        *trav = n_trav;
      }

    default:
      /* Unreachable, but compiler complaints */
      break;
  }

  return ret;
}